

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

void osgen_gridwin_resize(osgen_gridwin_t *win,size_t new_wid,size_t new_ht)

{
  char *pcVar1;
  osgen_charcolor_t *poVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  osgen_charcolor_t *poVar6;
  char *__src;
  char *pcVar7;
  size_t __n;
  osgen_charcolor_t *__src_00;
  
  __n = win->grid_wid;
  uVar4 = win->grid_ht;
  if (uVar4 < new_ht || __n < new_wid) {
    if (new_wid < __n) {
      new_wid = __n;
    }
    if (new_ht < uVar4) {
      new_ht = uVar4;
    }
    pcVar1 = (char *)malloc(new_ht * new_wid);
    poVar2 = (osgen_charcolor_t *)malloc(new_ht * new_wid * 2);
    poVar6 = poVar2;
    pcVar7 = pcVar1;
    if (uVar4 == 0) {
      uVar5 = 0;
    }
    else {
      __src = win->grid_txt;
      __src_00 = win->grid_color;
      uVar5 = 0;
      do {
        memcpy(pcVar7,__src,__n);
        memcpy(poVar6,__src_00,__n * 2);
        if (new_wid != __n) {
          do {
            pcVar7[__n] = ' ';
            poVar6[__n].fg = '\x02';
            poVar6[__n].bg = '\x01';
            __n = __n + 1;
          } while (new_wid != __n);
          __n = win->grid_wid;
          uVar4 = win->grid_ht;
        }
        __src = __src + __n;
        __src_00 = __src_00 + __n;
        pcVar7 = pcVar7 + new_wid;
        poVar6 = poVar6 + new_wid;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar4);
    }
    if (uVar5 < new_ht) {
      do {
        if (new_wid != 0) {
          memset(pcVar7,0x20,new_wid);
          sVar3 = 0;
          do {
            poVar6[sVar3].fg = '\x02';
            poVar6[sVar3].bg = '\x01';
            sVar3 = sVar3 + 1;
          } while (new_wid != sVar3);
        }
        uVar5 = uVar5 + 1;
        pcVar7 = pcVar7 + new_wid;
        poVar6 = poVar6 + new_wid;
      } while (uVar5 != new_ht);
    }
    free(win->grid_txt);
    free(win->grid_color);
    win->grid_txt = pcVar1;
    win->grid_color = poVar2;
    win->grid_wid = new_wid;
    win->grid_ht = new_ht;
  }
  return;
}

Assistant:

static void osgen_gridwin_resize(osgen_gridwin_t *win,
                                 size_t new_wid, size_t new_ht)
{
    /* if the window's size is now bigger than the grid, expand the grid */
    if (new_wid > win->grid_wid || new_ht > win->grid_ht)
    {
        char *new_txt;
        osgen_charcolor_t *new_color;
        char *tsrc, *tdst;
        osgen_charcolor_t *csrc, *cdst;
        size_t y;

        /*  
         *   use the larger of the old size and the new size, so that the
         *   window only expands (this somewhat simplifies copying the old
         *   to the new) 
         */
        if (win->grid_wid > new_wid)
            new_wid = win->grid_wid;
        if (win->grid_ht > new_ht)
            new_ht = win->grid_ht;

        /* allocate the new arrays */
        new_txt = (char *)osmalloc(new_wid * new_ht);
        new_color = (osgen_charcolor_t *)osmalloc(
            new_wid * new_ht * sizeof(new_color[0]));

        /* copy the old grid to the new grid */
        tsrc = win->grid_txt;
        csrc = win->grid_color;
        tdst = new_txt;
        cdst = new_color;
        for (y = 0 ; y < win->grid_ht ; ++y)
        {
            /* copy the old text and color data */
            memcpy(tdst, tsrc, win->grid_wid);
            memcpy(cdst, csrc, win->grid_wid * sizeof(cdst[0]));

            /* clear the rest of the line if expanding the width */
            osgen_gridwin_clear_ptr(tdst + win->grid_wid,
                                    cdst + win->grid_wid,
                                    new_wid - win->grid_wid);

            /* advance the pointers */
            tsrc += win->grid_wid;
            csrc += win->grid_wid;
            tdst += new_wid;
            cdst += new_wid;
        }

        /* clear all remaining lines */
        for ( ; y < new_ht ; ++y, tdst += new_wid, cdst += new_wid)
            osgen_gridwin_clear_ptr(tdst, cdst, new_wid);

        /* delete the old buffers */
        osfree(win->grid_txt);
        osfree(win->grid_color);

        /* set the new buffers and sizes */
        win->grid_txt = new_txt;
        win->grid_color = new_color;
        win->grid_wid = new_wid;
        win->grid_ht = new_ht;
    }
}